

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

bool __thiscall
ON_3dPointArray::Rotate
          (ON_3dPointArray *this,double sin_angle,double cos_angle,ON_3dVector *axis_of_rotation,
          ON_3dPoint *center_of_rotation)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  ON_3dPoint *pOVar5;
  bool rc;
  int local_104;
  undefined1 local_100 [4];
  int i;
  ON_SimpleArray<int> fix_index;
  undefined1 local_b8 [8];
  ON_Xform rot;
  int count;
  ON_3dPoint *center_of_rotation_local;
  ON_3dVector *axis_of_rotation_local;
  double cos_angle_local;
  double sin_angle_local;
  ON_3dPointArray *this_local;
  
  rot.m_xform[3][3]._4_4_ = (this->super_ON_SimpleArray<ON_3dPoint>).m_count;
  ON_Xform::ON_Xform((ON_Xform *)local_b8);
  fix_index._16_8_ = center_of_rotation->x;
  ON_Xform::Rotation((ON_Xform *)local_b8,sin_angle,cos_angle,*axis_of_rotation,*center_of_rotation)
  ;
  ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)local_100,0x80);
  for (local_104 = 0; local_104 < rot.m_xform[3][3]._4_4_; local_104 = local_104 + 1) {
    bVar2 = ON_3dPoint::operator==
                      ((this->super_ON_SimpleArray<ON_3dPoint>).m_a + local_104,center_of_rotation);
    if (bVar2) {
      ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)local_100,&local_104);
    }
  }
  bVar2 = Transform(this,(ON_Xform *)local_b8);
  for (local_104 = 0; iVar1 = local_104,
      iVar3 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)local_100), iVar1 < iVar3;
      local_104 = local_104 + 1) {
    pOVar5 = (this->super_ON_SimpleArray<ON_3dPoint>).m_a;
    piVar4 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)local_100,local_104);
    pOVar5 = pOVar5 + *piVar4;
    pOVar5->x = center_of_rotation->x;
    pOVar5->y = center_of_rotation->y;
    pOVar5->z = center_of_rotation->z;
  }
  ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)local_100);
  return bVar2;
}

Assistant:

bool ON_3dPointArray::Rotate(
      double sin_angle,
      double cos_angle,
      const ON_3dVector& axis_of_rotation,
      const ON_3dPoint& center_of_rotation
      )
{
  const int count = m_count;
  ON_Xform rot;
  rot.Rotation( sin_angle, cos_angle, axis_of_rotation, center_of_rotation );
  ON_SimpleArray<int> fix_index(128);
  int i;
  for ( i = 0; i < count; i++ ) {
    if ( m_a[i] == center_of_rotation )
      fix_index.Append(i);
  }
  const bool rc = Transform( rot );
  for ( i = 0; i < fix_index.Count(); i++ ) {
    m_a[fix_index[i]] = center_of_rotation;
  }
  return rc;
}